

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O0

Maybe<kj::Array<const_unsigned_char>_> * __thiscall
capnp::compiler::ModuleLoader::Impl::readEmbed
          (Maybe<kj::Array<const_unsigned_char>_> *__return_storage_ptr__,Impl *this,
          ReadableDirectory *dir,PathPtr path)

{
  Own<const_kj::ReadableFile,_std::nullptr_t> *pOVar1;
  ReadableFile *pRVar2;
  ReadableFile *pRVar3;
  undefined1 local_c8 [8];
  undefined8 local_c0;
  Array<const_unsigned_char> local_98;
  Own<const_kj::ReadableFile,_std::nullptr_t> *local_80;
  Own<const_kj::ReadableFile,_std::nullptr_t> *file;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> local_50;
  undefined1 local_40 [8];
  OwnOwn<const_kj::ReadableFile,_std::nullptr_t> _file271;
  ReadableDirectory *dir_local;
  Impl *this_local;
  PathPtr path_local;
  
  this_local._0_4_ = path.parts.ptr._0_4_;
  this_local._4_4_ = path.parts.ptr._4_4_;
  path_local.parts.ptr._0_4_ = (undefined4)path.parts.size_;
  path_local.parts.ptr._4_4_ = path.parts.size_._4_4_;
  local_68 = this_local._0_4_;
  uStack_64 = this_local._4_4_;
  uStack_60 = path_local.parts.ptr._0_4_;
  uStack_5c = path_local.parts.ptr._4_4_;
  _file271.value.ptr = (ReadableFile *)dir;
  (*(dir->super_FsNode)._vptr_FsNode[10])(&local_50,dir,path.parts.ptr,path.parts.size_);
  kj::_::readMaybe<kj::ReadableFile_const,decltype(nullptr)>((_ *)local_40,&local_50);
  kj::Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_>::~Maybe(&local_50);
  pOVar1 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_40);
  if (pOVar1 != (Own<const_kj::ReadableFile,_std::nullptr_t> *)0x0) {
    local_80 = kj::_::OwnOwn<const_kj::ReadableFile,_std::nullptr_t>::operator*
                         ((OwnOwn<const_kj::ReadableFile,_std::nullptr_t> *)local_40);
    pRVar2 = kj::Own<const_kj::ReadableFile,_std::nullptr_t>::operator->(local_80);
    pRVar3 = kj::Own<const_kj::ReadableFile,_std::nullptr_t>::operator->(local_80);
    (*(pRVar3->super_FsNode)._vptr_FsNode[2])(local_c8);
    (*(pRVar2->super_FsNode)._vptr_FsNode[7])(&local_98,pRVar2,0,local_c0);
    kj::Maybe<kj::Array<const_unsigned_char>_>::Maybe(__return_storage_ptr__,&local_98);
    kj::Array<const_unsigned_char>::~Array(&local_98);
  }
  kj::_::OwnOwn<const_kj::ReadableFile,_std::nullptr_t>::~OwnOwn
            ((OwnOwn<const_kj::ReadableFile,_std::nullptr_t> *)local_40);
  if (pOVar1 == (Own<const_kj::ReadableFile,_std::nullptr_t> *)0x0) {
    kj::Maybe<kj::Array<const_unsigned_char>_>::Maybe(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Array<const byte>> ModuleLoader::Impl::readEmbed(
    const kj::ReadableDirectory& dir, kj::PathPtr path) {
  KJ_IF_SOME(file, dir.tryOpenFile(path)) {
    return file->mmap(0, file->stat().size);
  }
  return kj::none;
}